

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::PDU::Gridded_Data_PDU::operator==(Gridded_Data_PDU *this,Gridded_Data_PDU *Value)

{
  pointer pKVar1;
  pointer pKVar2;
  pointer pKVar3;
  pointer pKVar4;
  KBOOL KVar5;
  pointer pKVar6;
  GridAxisRegular **ppGVar7;
  pointer pKVar8;
  GridData **ppGVar9;
  bool bVar10;
  
  KVar5 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (((((!KVar5) &&
        (KVar5 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EnvProcID,&Value->m_EnvProcID),
        !KVar5)) && (this->m_ui16FieldNum == Value->m_ui16FieldNum)) &&
      (((this->m_ui16PDUNum == Value->m_ui16PDUNum &&
        (this->m_ui16PDUTotal == Value->m_ui16PDUTotal)) &&
       ((this->m_ui16CordSys == Value->m_ui16CordSys &&
        ((this->m_ui8NumAxis == Value->m_ui8NumAxis &&
         (this->m_ui8ConstGrid == Value->m_ui8ConstGrid)))))))) &&
     ((KVar5 = DATA_TYPE::EnvironmentType::operator!=(&this->m_EnvType,&Value->m_EnvType), !KVar5 &&
      ((((KVar5 = DATA_TYPE::EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori), !KVar5 &&
         (this->m_ui64SampleTime == Value->m_ui64SampleTime)) &&
        (this->m_ui32TotalValues == Value->m_ui32TotalValues)) &&
       (this->m_ui8VecDim == Value->m_ui8VecDim)))))) {
    pKVar6 = (this->m_vpGridAxisDesc).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pKVar1 = (this->m_vpGridAxisDesc).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pKVar2 = (Value->m_vpGridAxisDesc).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pKVar1 - (long)pKVar6 ==
        (long)(Value->m_vpGridAxisDesc).
              super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar2) {
      if (pKVar6 != pKVar1) {
        ppGVar7 = &pKVar2->m_pRef;
        do {
          if (pKVar6->m_pRef != *ppGVar7) {
            return false;
          }
          pKVar6 = pKVar6 + 1;
          ppGVar7 = ppGVar7 + 3;
        } while (pKVar6 != pKVar1);
      }
      pKVar3 = (this->m_vGridData).
               super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pKVar4 = (this->m_vGridData).
               super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pKVar8 = (Value->m_vGridData).
               super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pKVar4 - (long)pKVar3 ==
          (long)(Value->m_vGridData).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar8) {
        if (pKVar3 == pKVar4) {
          return true;
        }
        ppGVar9 = &pKVar8->m_pRef;
        do {
          pKVar8 = pKVar3 + 1;
          bVar10 = pKVar3->m_pRef == *ppGVar9;
          if (!bVar10) {
            return bVar10;
          }
          ppGVar9 = ppGVar9 + 3;
          pKVar3 = pKVar8;
        } while (pKVar8 != pKVar4);
        return bVar10;
      }
    }
  }
  return false;
}

Assistant:

KBOOL Gridded_Data_PDU::operator == ( const Gridded_Data_PDU & Value ) const
{
    if( Header::operator  != ( Value ) )               return false;
    if( m_EnvProcID       != Value.m_EnvProcID )       return false;
    if( m_ui16FieldNum    != Value.m_ui16FieldNum )    return false;
    if( m_ui16PDUNum      != Value.m_ui16PDUNum )      return false;
    if( m_ui16PDUTotal    != Value.m_ui16PDUTotal )    return false;
    if( m_ui16CordSys     != Value.m_ui16CordSys )     return false;
    if( m_ui8NumAxis      != Value.m_ui8NumAxis )      return false;
    if( m_ui8ConstGrid    != Value.m_ui8ConstGrid )    return false;
    if( m_EnvType         != Value.m_EnvType )         return false;
    if( m_Ori             != Value.m_Ori )             return false;
    if( m_ui64SampleTime  != Value.m_ui64SampleTime )  return false;
    if( m_ui32TotalValues != Value.m_ui32TotalValues ) return false;
    if( m_ui8VecDim       != Value.m_ui8VecDim )       return false;
    if( m_vpGridAxisDesc  != Value.m_vpGridAxisDesc )  return false;
    if( m_vGridData       != Value.m_vGridData )       return false;
    return true;
}